

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O2

void ihevc_deblk_luma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  byte bVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  byte bVar34;
  int iVar35;
  long lVar36;
  
  if (bs < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x162,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (filter_flag_q != 0 || filter_flag_p != 0) {
    iVar22 = quant_param_q + quant_param_p + 1 >> 1;
    uVar23 = iVar22 + beta_offset_div2 * 2;
    if ((int)uVar23 < 1) {
      uVar23 = 0;
    }
    uVar8 = 0x33;
    if ((int)uVar23 < 0x33) {
      uVar8 = (ulong)uVar23;
    }
    uVar23 = (bs & 0x7ffffffeU) + iVar22 + tc_offset_div2 * 2;
    uVar25 = 0;
    if (0 < (int)uVar23) {
      uVar25 = uVar23;
    }
    uVar6 = 0x35;
    if ((int)uVar25 < 0x35) {
      uVar6 = (ulong)uVar25;
    }
    uVar23 = gai4_ihevc_tc_table[uVar6];
    if (uVar23 != 0) {
      lVar33 = (long)src_strd;
      bVar21 = *pu1_src;
      iVar4 = (uint)pu1_src[lVar33 * 2] + (uint)pu1_src[lVar33] * -2 + (uint)bVar21;
      iVar22 = -iVar4;
      if (0 < iVar4) {
        iVar22 = iVar4;
      }
      bVar11 = pu1_src[3];
      iVar12 = (uint)pu1_src[lVar33 * 2 + 3] + (uint)pu1_src[lVar33 + 3] * -2 + (uint)bVar11;
      iVar4 = -iVar12;
      if (0 < iVar12) {
        iVar4 = iVar12;
      }
      lVar1 = lVar33 * 2;
      lVar30 = lVar33 * -3;
      bVar9 = pu1_src[-lVar33];
      iVar13 = (uint)pu1_src[lVar30] + (uint)pu1_src[lVar33 * -2] * -2 + (uint)bVar9;
      iVar12 = -iVar13;
      if (0 < iVar13) {
        iVar12 = iVar13;
      }
      uVar25 = gai4_ihevc_beta_table[uVar8];
      lVar3 = lVar33 * 3;
      iVar35 = (uint)(pu1_src + -lVar33)[3] +
               (uint)pu1_src[3 - (long)(int)lVar3] + (uint)pu1_src[3 - (long)(int)lVar1] * -2;
      iVar13 = -iVar35;
      if (0 < iVar35) {
        iVar13 = iVar35;
      }
      if (iVar13 + iVar4 + iVar12 + iVar22 < (int)uVar25) {
        if ((uint)((iVar12 + iVar22) * 2) < uVar25 >> 2) {
          iVar14 = (uint)pu1_src[lVar3] - (uint)bVar21;
          iVar35 = -iVar14;
          if (0 < iVar14) {
            iVar35 = iVar14;
          }
          iVar31 = (uint)bVar9 - (uint)pu1_src[lVar33 * -4];
          iVar14 = -iVar31;
          if (0 < iVar31) {
            iVar14 = iVar31;
          }
          if ((uint)(iVar14 + iVar35) < uVar25 >> 3) {
            iVar14 = (uint)bVar21 - (uint)bVar9;
            iVar35 = -iVar14;
            if (0 < iVar14) {
              iVar35 = iVar14;
            }
            bVar2 = iVar35 < (int)(uVar23 * 5 + 1) >> 1;
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
        lVar29 = -lVar33;
        if ((uint)((iVar13 + iVar4) * 2) < uVar25 >> 2) {
          iVar14 = (uint)pu1_src[lVar3 + 3] - (uint)bVar11;
          iVar35 = -iVar14;
          if (0 < iVar14) {
            iVar35 = iVar14;
          }
          lVar36 = lVar33 * -4;
          iVar14 = (uint)pu1_src[lVar29 + 3] - (uint)pu1_src[lVar33 * -4 + 3];
          bVar21 = (byte)iVar14;
          bVar9 = -bVar21;
          if (0 < iVar14) {
            bVar9 = bVar21;
          }
          if ((uint)bVar9 + iVar35 < uVar25 >> 3) {
            iVar14 = (uint)bVar11 - (uint)pu1_src[lVar29 + 3];
            iVar35 = -iVar14;
            if (0 < iVar14) {
              iVar35 = iVar14;
            }
            bVar10 = iVar35 < (int)(uVar23 * 5 + 1) >> 1;
          }
          else {
            bVar10 = false;
          }
        }
        else {
          lVar36 = (long)(src_strd * -4);
          bVar10 = false;
        }
        uVar15 = (uVar25 >> 1) + uVar25 >> 3;
        uVar25 = uVar23 >> 1;
        uVar5 = -uVar25;
        iVar35 = uVar23 * 2;
        for (lVar18 = 0; (int)lVar18 != 4; lVar18 = lVar18 + 1) {
          bVar21 = pu1_src[lVar18 + lVar29];
          uVar17 = (uint)bVar21;
          bVar11 = pu1_src[lVar18 + lVar33 * -2];
          uVar20 = (uint)bVar11;
          bVar9 = pu1_src[lVar18 + lVar30];
          uVar24 = (uint)bVar9;
          bVar34 = pu1_src[lVar18];
          uVar27 = (uint)bVar34;
          bVar19 = pu1_src[lVar18 + lVar33];
          uVar26 = (uint)bVar19;
          bVar7 = pu1_src[lVar18 + lVar1];
          uVar32 = (uint)bVar7;
          if ((bool)(bVar2 & bVar10)) {
            iVar14 = uVar27 + uVar17 + uVar26;
            uVar16 = uVar20 + uVar32 + iVar14 * 2 + 4 >> 3;
            uVar28 = uVar27 + uVar23 * -2;
            if ((int)uVar28 < (int)uVar16) {
              uVar28 = uVar16;
            }
            if ((int)(iVar35 + uVar27) < (int)uVar16) {
              uVar28 = iVar35 + uVar27;
            }
            bVar34 = (byte)uVar28;
            uVar16 = iVar14 + uVar32 + 2 >> 2;
            uVar28 = uVar26 + uVar23 * -2;
            if ((int)uVar28 < (int)uVar16) {
              uVar28 = uVar16;
            }
            if ((int)(iVar35 + uVar26) < (int)uVar16) {
              uVar28 = iVar35 + uVar26;
            }
            bVar19 = (byte)uVar28;
            uVar16 = uVar32 * 3 + iVar14 + (uint)pu1_src[lVar18 + lVar3] * 2 + 4 >> 3;
            uVar28 = uVar32 + uVar23 * -2;
            if ((int)uVar28 < (int)uVar16) {
              uVar28 = uVar16;
            }
            iVar14 = uVar27 + uVar17 + uVar20;
            uVar27 = uVar26 + uVar24 + iVar14 * 2 + 4 >> 3;
            uVar26 = uVar17 + uVar23 * -2;
            if ((int)uVar26 < (int)uVar27) {
              uVar26 = uVar27;
            }
            if ((int)(iVar35 + uVar17) < (int)uVar27) {
              uVar26 = iVar35 + uVar17;
            }
            bVar21 = (byte)uVar26;
            uVar26 = uVar24 + iVar14 + 2 >> 2;
            uVar17 = uVar20 + uVar23 * -2;
            if ((int)uVar17 < (int)uVar26) {
              uVar17 = uVar26;
            }
            if ((int)(iVar35 + uVar20) < (int)uVar26) {
              uVar17 = iVar35 + uVar20;
            }
            bVar11 = (byte)uVar17;
            uVar20 = uVar24 * 3 + iVar14 + (uint)pu1_src[lVar18 + lVar36] * 2 + 4 >> 3;
            uVar17 = uVar24 + uVar23 * -2;
            if ((int)uVar17 < (int)uVar20) {
              uVar17 = uVar20;
            }
            if ((int)(iVar35 + uVar24) < (int)uVar20) {
              uVar17 = iVar35 + uVar24;
            }
            if ((int)(iVar35 + uVar32) < (int)uVar16) {
              uVar28 = iVar35 + uVar32;
            }
            bVar7 = (byte)uVar28;
            bVar9 = (byte)uVar17;
          }
          else {
            uVar16 = (int)((uVar27 - uVar17) * 9 + (uVar26 - uVar20) * -3 + 8) >> 4;
            uVar28 = -uVar16;
            if (0 < (int)uVar16) {
              uVar28 = uVar16;
            }
            if ((int)uVar28 < (int)(uVar23 * 10)) {
              uVar28 = uVar16;
              if ((int)uVar16 <= (int)-uVar23) {
                uVar28 = -uVar23;
              }
              if ((int)uVar23 < (int)uVar16) {
                uVar28 = uVar23;
              }
              iVar14 = uVar28 + uVar17;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              bVar21 = (byte)iVar14;
              iVar14 = uVar27 - uVar28;
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              bVar34 = (byte)iVar14;
              if ((uint)(iVar13 + iVar12) < uVar15 && 1 < (int)uVar23) {
                uVar24 = (int)(((uVar24 + uVar17 + 1 >> 1 & 0xff) - uVar20) + uVar28) >> 1;
                uVar17 = uVar24;
                if ((int)uVar24 <= (int)uVar5) {
                  uVar17 = uVar5;
                }
                if ((int)uVar25 < (int)uVar24) {
                  uVar17 = uVar25;
                }
                iVar14 = uVar17 + uVar20;
                bVar11 = 0xff;
                if (iVar14 < 0x100) {
                  if (iVar14 < 1) {
                    iVar14 = 0;
                  }
                  bVar11 = (byte)iVar14;
                }
              }
              if ((uint)(iVar4 + iVar22) < uVar15 && 1 < (int)uVar23) {
                uVar20 = (int)((uVar27 + uVar32 + 1 >> 1 & 0xff) - (uVar28 + uVar26)) >> 1;
                uVar17 = uVar20;
                if ((int)uVar20 <= (int)uVar5) {
                  uVar17 = uVar5;
                }
                if ((int)uVar25 < (int)uVar20) {
                  uVar17 = uVar25;
                }
                iVar14 = uVar17 + uVar26;
                if (iVar14 < 0x100) {
                  if (iVar14 < 1) {
                    iVar14 = 0;
                  }
                  bVar19 = (byte)iVar14;
                }
                else {
                  bVar19 = 0xff;
                }
              }
            }
          }
          if (filter_flag_p != 0) {
            pu1_src[lVar18 + lVar30] = bVar9;
            pu1_src[lVar18 + lVar33 * -2] = bVar11;
            pu1_src[lVar18 + lVar29] = bVar21;
          }
          if (filter_flag_q != 0) {
            pu1_src[lVar18] = bVar34;
            pu1_src[lVar18 + lVar33] = bVar19;
            pu1_src[lVar18 + lVar1] = bVar7;
          }
        }
      }
    }
    return;
  }
  __assert_fail("(filter_flag_p || filter_flag_q)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                ,0x163,
                "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_deblk_luma_horz(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 bs,
                           WORD32 quant_param_p,
                           WORD32 quant_param_q,
                           WORD32 beta_offset_div2,
                           WORD32 tc_offset_div2,
                           WORD32 filter_flag_p,
                           WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;
    WORD32 dp0, dp3, dq0, dq3, d0, d3, dp, dq, d;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;
    WORD32 col;
    WORD32 tmp_p0, tmp_p1, tmp_p2, tmp_q0, tmp_q1, tmp_q2;
    WORD32 delta, delta_p, delta_q;

    ASSERT((bs > 0));
    ASSERT(filter_flag_p || filter_flag_q);

    qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
    beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

    /* BS based on implementation can take value 3 if it is intra/inter egde          */
    /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
    /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
    /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

    tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

    beta = gai4_ihevc_beta_table[beta_indx];
    tc = gai4_ihevc_tc_table[tc_indx];
    if(0 == tc)
    {
        return;
    }

    dq0 = ABS(pu1_src[2 * src_strd] - 2 * pu1_src[1 * src_strd] +
                    pu1_src[0 * src_strd]);

    dq3 = ABS(pu1_src[3 + 2 * src_strd] - 2 * pu1_src[3 + 1 * src_strd] +
                    pu1_src[3 + 0 * src_strd]);

    dp0 = ABS(pu1_src[-3 * src_strd] - 2 * pu1_src[-2 * src_strd] +
                    pu1_src[-1 * src_strd]);

    dp3 = ABS(pu1_src[3 - 3 * src_strd] - 2 * pu1_src[3 - 2 * src_strd] +
                    pu1_src[3 - 1 * src_strd]);

    d0 = dp0 + dq0;
    d3 = dp3 + dq3;

    dp = dp0 + dp3;
    dq = dq0 + dq3;

    d = d0 + d3;

    de = 0;
    dep = 0;
    deq = 0;

    if(d < beta)
    {
        d_sam0 = 0;
        if((2 * d0 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam0 = 1;
        }

        pu1_src += 3;
        d_sam3 = 0;
        if((2 * d3 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam3 = 1;
        }
        pu1_src -= 3;

        de = (d_sam0 == 1 && d_sam3 == 1) ? 2 : 1;
        dep = (dp < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        deq = (dq < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        if(tc <= 1)
        {
            dep = 0;
            deq = 0;
        }
    }

    if(de != 0)
    {
        for(col = 0; col < 4; col++)
        {
            tmp_p0 = pu1_src[-1 * src_strd];
            tmp_p1 = pu1_src[-2 * src_strd];
            tmp_p2 = pu1_src[-3 * src_strd];

            tmp_q0 = pu1_src[0 * src_strd];
            tmp_q1 = pu1_src[1 * src_strd];
            tmp_q2 = pu1_src[2 * src_strd];
            if(de == 2)
            {
                tmp_q0 = CLIP3((pu1_src[2 * src_strd] +
                                2 * pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] + 4) >> 3,
                                pu1_src[0 * src_strd] - 2 * tc,
                                pu1_src[0 * src_strd] + 2 * tc);

                tmp_q1 = CLIP3((pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 2) >> 2,
                                pu1_src[1 * src_strd] - 2 * tc,
                                pu1_src[1 * src_strd] + 2 * tc);

                tmp_q2 = CLIP3((2 * pu1_src[3 * src_strd] +
                                3 * pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 4) >> 3,
                                pu1_src[2 * src_strd] - 2 * tc,
                                pu1_src[2 * src_strd] + 2 * tc);

                tmp_p0 = CLIP3((pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                2 * pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 4) >> 3,
                                pu1_src[-1 * src_strd] - 2 * tc,
                                pu1_src[-1 * src_strd] + 2 * tc);

                tmp_p1 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 2) >> 2,
                                pu1_src[-2 * src_strd] - 2 * tc,
                                pu1_src[-2 * src_strd] + 2 * tc);

                tmp_p2 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                3 * pu1_src[-3 * src_strd] +
                                2 * pu1_src[-4 * src_strd] + 4) >> 3,
                                pu1_src[-3 * src_strd] - 2 * tc,
                                pu1_src[-3 * src_strd] + 2 * tc);
            }
            else
            {
                delta = (9 * (pu1_src[0 * src_strd] - pu1_src[-1 * src_strd]) -
                                3 * (pu1_src[1 * src_strd] - pu1_src[-2 * src_strd]) +
                                8) >> 4;
                if(ABS(delta) < 10 * tc)
                {
                    delta = CLIP3(delta, -tc, tc);

                    tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
                    tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

                    if(dep == 1)
                    {
                        delta_p = CLIP3((((pu1_src[-3 * src_strd] +
                                        pu1_src[-1 * src_strd] + 1) >> 1) -
                                        pu1_src[-2 * src_strd] + delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_p1 = CLIP_U8(pu1_src[-2 * src_strd] + delta_p);
                    }

                    if(deq == 1)
                    {
                        delta_q = CLIP3((((pu1_src[2 * src_strd] +
                                        pu1_src[0 * src_strd] + 1) >> 1) -
                                        pu1_src[1 * src_strd] - delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_q1 = CLIP_U8(pu1_src[1 * src_strd] + delta_q);
                    }
                }
            }

            if(filter_flag_p != 0)
            {
                pu1_src[-3 * src_strd] = tmp_p2;
                pu1_src[-2 * src_strd] = tmp_p1;
                pu1_src[-1 * src_strd] = tmp_p0;
            }

            if(filter_flag_q != 0)
            {
                pu1_src[0 * src_strd] = tmp_q0;
                pu1_src[1 * src_strd] = tmp_q1;
                pu1_src[2 * src_strd] = tmp_q2;
            }

            pu1_src += 1;
        }
    }

}